

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O3

void loope_(PDISASM pMyDisasm)

{
  Int64 *pIVar1;
  char cVar2;
  int iVar3;
  ulong uVar4;
  UInt8 UVar5;
  UInt8 UVar6;
  UInt8 UVar7;
  UInt8 UVar8;
  UInt8 UVar9;
  UInt8 UVar10;
  UInt8 UVar11;
  char *pFormat;
  UInt64 UVar12;
  
  (pMyDisasm->Instruction).Category = 0x10006;
  (pMyDisasm->Instruction).BranchType = 3;
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"loope",6);
  uVar4 = (pMyDisasm->Reserved_).EndOfBlock;
  if ((uVar4 == 0) || ((pMyDisasm->Reserved_).EIP_ + 2 <= uVar4)) {
    UVar12 = (pMyDisasm->Reserved_).EIP_VA;
    cVar2 = *(char *)((pMyDisasm->Reserved_).EIP_ + 1);
    iVar3 = (pMyDisasm->Reserved_).NB_PREFIX;
    (pMyDisasm->Reserved_).RelativeAddress = 1;
    if ((pMyDisasm->Reserved_).OperandSize < 0x20) {
      if (UVar12 == 0) {
        UVar12 = (pMyDisasm->Reserved_).EIP_REAL;
      }
      UVar12 = (UInt64)((int)UVar12 + iVar3 + cVar2 + 2U & 0xffff);
      pFormat = "%.4X";
    }
    else {
      if (UVar12 == 0) {
        UVar12 = (pMyDisasm->Reserved_).EIP_REAL;
      }
      UVar12 = UVar12 + (long)cVar2 + (long)iVar3 + 2;
      pFormat = "%.8X";
      if (UVar12 >> 0x20 != 0) {
        pFormat = "%.16llX";
      }
    }
    CopyFormattedNumber(pMyDisasm,(pMyDisasm->Operand1).OpMnemonic,pFormat,UVar12);
    (pMyDisasm->Operand1).AccessMode = 1;
    (pMyDisasm->Operand1).OpSize = 8;
    (pMyDisasm->Operand1).OpType = 0x4040000;
    (pMyDisasm->Instruction).ImplicitModifiedRegs.gpr = 2;
    (pMyDisasm->Instruction).AddrValue = UVar12;
    (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 2;
    (pMyDisasm->Instruction).ImplicitModifiedRegs.type = 0x21;
    pIVar1 = &(pMyDisasm->Instruction).ImplicitModifiedRegs.special;
    *(byte *)pIVar1 = (byte)*pIVar1 | 1;
    UVar5 = EFLAGS_TABLE[0x3d].SF_;
    UVar6 = EFLAGS_TABLE[0x3d].ZF_;
    UVar7 = EFLAGS_TABLE[0x3d].AF_;
    UVar8 = EFLAGS_TABLE[0x3d].PF_;
    UVar9 = EFLAGS_TABLE[0x3d].CF_;
    UVar10 = EFLAGS_TABLE[0x3d].TF_;
    UVar11 = EFLAGS_TABLE[0x3d].IF_;
    (pMyDisasm->Instruction).Flags.OF_ = EFLAGS_TABLE[0x3d].OF_;
    (pMyDisasm->Instruction).Flags.SF_ = UVar5;
    (pMyDisasm->Instruction).Flags.ZF_ = UVar6;
    (pMyDisasm->Instruction).Flags.AF_ = UVar7;
    (pMyDisasm->Instruction).Flags.PF_ = UVar8;
    (pMyDisasm->Instruction).Flags.CF_ = UVar9;
    (pMyDisasm->Instruction).Flags.TF_ = UVar10;
    (pMyDisasm->Instruction).Flags.IF_ = UVar11;
    UVar5 = EFLAGS_TABLE[0x3d].NT_;
    UVar6 = EFLAGS_TABLE[0x3d].RF_;
    UVar7 = EFLAGS_TABLE[0x3d].alignment;
    (pMyDisasm->Instruction).Flags.DF_ = EFLAGS_TABLE[0x3d].DF_;
    (pMyDisasm->Instruction).Flags.NT_ = UVar5;
    (pMyDisasm->Instruction).Flags.RF_ = UVar6;
    (pMyDisasm->Instruction).Flags.alignment = UVar7;
  }
  else {
    (pMyDisasm->Reserved_).OutOfBlock = 1;
    (pMyDisasm->Reserved_).ERROR_OPCODE = -2;
  }
  return;
}

Assistant:

void __bea_callspec__ loope_(PDISASM pMyDisasm)
{
    signed long MyNumber;
    UInt64 MyAddress;
    pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+CONTROL_TRANSFER;
    pMyDisasm->Instruction.BranchType = JE;
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy (pMyDisasm->Instruction.Mnemonic, "loope");
    #endif
    if (!Security(2, pMyDisasm)) return;
    if (GV.OperandSize >= 32) {
        MyNumber = *((Int8*) (GV.EIP_+1));
        CalculateRelativeAddress(&MyAddress,(Int64) GV.NB_PREFIX+2+MyNumber, pMyDisasm);
        if (MyAddress >= W64LIT (0x100000000)) {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) CopyFormattedNumber(pMyDisasm, (char*) pMyDisasm->Operand1.OpMnemonic, "%.16llX",(Int64) MyAddress);
            #endif
        }
        else {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) CopyFormattedNumber(pMyDisasm, (char*) pMyDisasm->Operand1.OpMnemonic, "%.8X",(Int64) MyAddress);
            #endif
        }
        pMyDisasm->Operand1.AccessMode = READ;
        pMyDisasm->Operand1.OpSize = 8;
        pMyDisasm->Operand1.OpType = CONSTANT_TYPE+RELATIVE_;
        pMyDisasm->Instruction.ImplicitModifiedRegs.type = GENERAL_REG;
        pMyDisasm->Instruction.ImplicitModifiedRegs.gpr = REG1;
        pMyDisasm->Instruction.AddrValue = MyAddress;
        GV.EIP_+=2;
        FillFlags(pMyDisasm, 61);
    }
    else {
        MyNumber = *((Int8*) (GV.EIP_+1));
        CalculateRelativeAddress(&MyAddress,(Int64) GV.NB_PREFIX+2+MyNumber, pMyDisasm);
        MyAddress = MyAddress & 0xffff;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) CopyFormattedNumber(pMyDisasm, (char*) pMyDisasm->Operand1.OpMnemonic, "%.4X",(Int64) MyAddress);
        #endif
        pMyDisasm->Operand1.AccessMode = READ;
        pMyDisasm->Operand1.OpSize = 8;
        pMyDisasm->Operand1.OpType = CONSTANT_TYPE+RELATIVE_;
        pMyDisasm->Instruction.ImplicitModifiedRegs.type = GENERAL_REG;
        pMyDisasm->Instruction.ImplicitModifiedRegs.gpr = REG1;
        pMyDisasm->Instruction.AddrValue = MyAddress;
        GV.EIP_+=2;
        FillFlags(pMyDisasm, 61);

    }
}